

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddLanguageFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,cmBuildStep compileOrLink,
          string *lang,string *config)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  string *psVar4;
  cmValue cVar5;
  cmValue cVar6;
  long lVar7;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  undefined1 local_2b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  cmAlphaNum local_280;
  string msvcRuntimeLibrary;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [36];
  cmBuildStep local_1cc;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  msvcDebugInformationFormat;
  cmAlphaNum local_1a0;
  string compiler;
  string compilerSimulateId;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  msvcRuntimeLibrary._M_dataplus._M_p = &DAT_00000006;
  msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
  local_2b0._8_8_ = (lang->_M_dataplus)._M_p;
  local_2b0._0_8_ = lang->_M_string_length;
  local_1cc = compileOrLink;
  cmStrCat<char[7]>((string *)&local_280,(cmAlphaNum *)&msvcRuntimeLibrary,(cmAlphaNum *)local_2b0,
                    (char (*) [7])0x5f3c3a);
  AddConfigVariableFlags(this,flags,(string *)&local_280,config);
  std::__cxx11::string::~string((string *)&local_280);
  pcVar1 = this->Makefile;
  msvcRuntimeLibrary._M_dataplus._M_p = &DAT_00000006;
  msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
  local_2b0._8_8_ = (lang->_M_dataplus)._M_p;
  local_2b0._0_8_ = lang->_M_string_length;
  cmStrCat<char[13]>((string *)&local_280,(cmAlphaNum *)&msvcRuntimeLibrary,(cmAlphaNum *)local_2b0,
                     (char (*) [13])0x5e1ada);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_280);
  std::__cxx11::string::string((string *)&compiler,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_280);
  pcVar1 = this->Makefile;
  msvcRuntimeLibrary._M_dataplus._M_p = &DAT_00000006;
  msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
  local_2b0._8_8_ = (lang->_M_dataplus)._M_p;
  local_2b0._0_8_ = lang->_M_string_length;
  cmStrCat<char[13]>((string *)&local_280,(cmAlphaNum *)&msvcRuntimeLibrary,(cmAlphaNum *)local_2b0,
                     (char (*) [13])0x5b7197);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,(string *)&local_280);
  std::__cxx11::string::string((string *)&compilerSimulateId,(string *)psVar4);
  std::__cxx11::string::~string((string *)&local_280);
  bVar2 = std::operator==(lang,"Swift");
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msvcRuntimeLibrary,"Swift_LANGUAGE_VERSION",(allocator<char> *)local_2b0);
    cVar5 = cmGeneratorTarget::GetProperty(target,&msvcRuntimeLibrary);
    std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
    if (cVar5.Value != (string *)0x0) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msvcRuntimeLibrary,"CMAKE_Swift_COMPILER_VERSION",
                 (allocator<char> *)local_2b0);
      psVar4 = (string *)cmMakefile::GetDefinition(pcVar1,&msvcRuntimeLibrary);
      if (psVar4 == (string *)0x0) {
        psVar4 = &cmValue::Empty_abi_cxx11_;
      }
      bVar2 = cmSystemTools::VersionCompare(OP_GREATER_EQUAL,psVar4,"4.2");
      std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
      if (bVar2) {
        std::operator+(&msvcRuntimeLibrary,"-swift-version ",cVar5.Value);
        (*this->_vptr_cmLocalGenerator[6])(this,flags,&msvcRuntimeLibrary);
LAB_001d3f77:
        std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
      }
    }
  }
  else {
    bVar2 = std::operator==(lang,"CUDA");
    if (bVar2) {
      cmGeneratorTarget::AddCUDAArchitectureFlags(target,local_1cc,config,flags);
      cmGeneratorTarget::AddCUDAToolkitFlags(target,flags);
    }
    else {
      bVar2 = std::operator==(lang,"ISPC");
      if (bVar2) {
        cmGeneratorTarget::AddISPCTargetFlags(target,flags);
      }
      else {
        bVar2 = std::operator==(lang,"RC");
        if (bVar2) {
          pcVar1 = this->Makefile;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msvcRuntimeLibrary,"CMAKE_RC_COMPILER",(allocator<char> *)local_2b0)
          ;
          psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&msvcRuntimeLibrary);
          lVar7 = std::__cxx11::string::find((char *)psVar4,0x5b7174);
          std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
          if (lVar7 != -1) {
            pcVar1 = this->Makefile;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&msvcRuntimeLibrary,"CMAKE_C_COMPILER_ID",
                       (allocator<char> *)local_2b0);
            cmMakefile::GetSafeDefinition(pcVar1,&msvcRuntimeLibrary);
            std::__cxx11::string::_M_assign((string *)&compiler);
            std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
            pcVar1 = this->Makefile;
            if (compiler._M_string_length == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&msvcRuntimeLibrary,"CMAKE_CXX_COMPILER_ID",
                         (allocator<char> *)local_2b0);
              cmMakefile::GetSafeDefinition(pcVar1,&msvcRuntimeLibrary);
              std::__cxx11::string::_M_assign((string *)&compiler);
              std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
              pcVar1 = this->Makefile;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&msvcRuntimeLibrary,"CMAKE_CXX_SIMULATE_ID",
                         (allocator<char> *)local_2b0);
              cmMakefile::GetSafeDefinition(pcVar1,&msvcRuntimeLibrary);
              std::__cxx11::string::_M_assign((string *)&compilerSimulateId);
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&msvcRuntimeLibrary,"CMAKE_C_SIMULATE_ID",
                         (allocator<char> *)local_2b0);
              cmMakefile::GetSafeDefinition(pcVar1,&msvcRuntimeLibrary);
              std::__cxx11::string::_M_assign((string *)&compilerSimulateId);
            }
            goto LAB_001d3f77;
          }
        }
        bVar2 = std::operator==(lang,"HIP");
        if (bVar2) {
          cmGeneratorTarget::AddHIPArchitectureFlags(target,flags);
        }
      }
    }
  }
  bVar2 = std::operator==(&compiler,"Clang");
  if (bVar2) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msvcRuntimeLibrary,"CMAKE_CLANG_VFS_OVERLAY",(allocator<char> *)local_2b0)
    ;
    cVar5 = cmMakefile::GetDefinition(pcVar1,&msvcRuntimeLibrary);
    std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
    if (cVar5.Value != (string *)0x0) {
      bVar2 = std::operator==(&compilerSimulateId,"MSVC");
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msvcRuntimeLibrary,"-Xclang",(allocator<char> *)&local_280);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_230,"-ivfsoverlay",(allocator<char> *)&local_1a0);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_210,"-Xclang",(allocator<char> *)&msvcDebugInformationFormat);
        std::__cxx11::string::string(local_1f0,(string *)cVar5.Value);
        __l._M_len = 4;
        __l._M_array = &msvcRuntimeLibrary;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2b0,__l,(allocator_type *)&local_130);
        AppendCompileOptions
                  (this,flags,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2b0,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2b0);
        lVar7 = 0x60;
        do {
          std::__cxx11::string::~string(local_230 + lVar7 + -0x20);
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != -0x20);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&msvcRuntimeLibrary,"-ivfsoverlay",(allocator<char> *)&local_280);
        std::__cxx11::string::string(local_230,(string *)cVar5.Value);
        __l_00._M_len = 2;
        __l_00._M_array = &msvcRuntimeLibrary;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_2b0,__l_00,(allocator_type *)&local_1a0);
        AppendCompileOptions
                  (this,flags,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2b0,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2b0);
        lVar7 = 0x20;
        do {
          std::__cxx11::string::~string(local_230 + lVar7 + -0x20);
          lVar7 = lVar7 + -0x20;
        } while (lVar7 != -0x20);
      }
    }
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msvcRuntimeLibrary,"CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT",
             (allocator<char> *)local_2b0);
  cVar5 = cmMakefile::GetDefinition(pcVar1,&msvcRuntimeLibrary);
  std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
  if ((cVar5.Value != (string *)0x0) && ((cVar5.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msvcRuntimeLibrary,"MSVC_RUNTIME_LIBRARY",(allocator<char> *)local_2b0);
    cVar6 = cmGeneratorTarget::GetProperty(target,&msvcRuntimeLibrary);
    std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
    if (cVar6.Value != (string *)0x0) {
      cVar5 = cVar6;
    }
    std::__cxx11::string::string((string *)&local_50,(string *)cVar5.Value);
    local_2b0._0_8_ = &local_2a0;
    local_2b0._8_8_ = (pointer)0x0;
    local_2a0._M_dataplus._M_p._0_1_ = '\0';
    cmGeneratorExpression::Evaluate
              (&msvcRuntimeLibrary,&local_50,this,config,target,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,(string *)local_2b0);
    std::__cxx11::string::~string((string *)local_2b0);
    std::__cxx11::string::~string((string *)&local_50);
    if (msvcRuntimeLibrary._M_string_length != 0) {
      pcVar1 = this->Makefile;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0
                     ,"CMAKE_",lang);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_1a0,"_COMPILE_OPTIONS_MSVC_RUNTIME_LIBRARY_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280
                     ,&msvcRuntimeLibrary);
      cVar5 = cmMakefile::GetDefinition(pcVar1,(string *)local_2b0);
      std::__cxx11::string::~string((string *)local_2b0);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_1a0);
      if (cVar5.Value == (string *)0x0) {
        pcVar1 = this->Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_280,"CMAKE_",lang);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_280,"_COMPILER_ID");
        psVar4 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_2b0);
        bVar2 = std::operator==(psVar4,"MSVC");
        if (bVar2) {
LAB_001d4533:
          bVar3 = cmSystemTools::GetErrorOccurredFlag();
          bVar3 = !bVar3;
          if (!bVar2) goto LAB_001d4549;
        }
        else {
          pcVar1 = this->Makefile;
          std::operator+(&local_70,"CMAKE_",lang);
          std::operator+(&local_130,&local_70,"_SIMULATE_ID");
          psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_130);
          bVar3 = std::operator==(psVar4,"MSVC");
          if (bVar3) goto LAB_001d4533;
          bVar3 = false;
LAB_001d4549:
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_70);
        }
        std::__cxx11::string::~string((string *)local_2b0);
        std::__cxx11::string::~string((string *)&local_280);
        if (bVar3) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &msvcDebugInformationFormat,"MSVC_RUNTIME_LIBRARY value \'",
                         &msvcRuntimeLibrary);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &msvcDebugInformationFormat,"\' not known for this ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_280,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1a0,lang);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_280," compiler.");
          IssueMessage(this,FATAL_ERROR,(string *)local_2b0);
          std::__cxx11::string::~string((string *)local_2b0);
          std::__cxx11::string::~string((string *)&local_280);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&msvcDebugInformationFormat);
        }
      }
      else {
        AppendCompileOptions(this,flags,cVar5.Value,(char *)0x0);
      }
    }
    std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
  }
  pcVar1 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&msvcRuntimeLibrary,"CMAKE_WATCOM_RUNTIME_LIBRARY_DEFAULT",
             (allocator<char> *)local_2b0);
  cVar5 = cmMakefile::GetDefinition(pcVar1,&msvcRuntimeLibrary);
  std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
  if ((cVar5.Value != (string *)0x0) && ((cVar5.Value)->_M_string_length != 0)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msvcRuntimeLibrary,"WATCOM_RUNTIME_LIBRARY",(allocator<char> *)local_2b0);
    cVar6 = cmGeneratorTarget::GetProperty(target,&msvcRuntimeLibrary);
    std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
    if (cVar6.Value != (string *)0x0) {
      cVar5 = cVar6;
    }
    std::__cxx11::string::string((string *)&local_90,(string *)cVar5.Value);
    local_2b0._0_8_ = &local_2a0;
    local_2b0._8_8_ = (pointer)0x0;
    local_2a0._M_dataplus._M_p._0_1_ = '\0';
    cmGeneratorExpression::Evaluate
              (&msvcRuntimeLibrary,&local_90,this,config,target,
               (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,(string *)local_2b0);
    std::__cxx11::string::~string((string *)local_2b0);
    std::__cxx11::string::~string((string *)&local_90);
    if (msvcRuntimeLibrary._M_string_length != 0) {
      pcVar1 = this->Makefile;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a0
                     ,"CMAKE_",lang);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_1a0,"_COMPILE_OPTIONS_WATCOM_RUNTIME_LIBRARY_");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_280
                     ,&msvcRuntimeLibrary);
      cVar5 = cmMakefile::GetDefinition(pcVar1,(string *)local_2b0);
      std::__cxx11::string::~string((string *)local_2b0);
      std::__cxx11::string::~string((string *)&local_280);
      std::__cxx11::string::~string((string *)&local_1a0);
      if (cVar5.Value == (string *)0x0) {
        pcVar1 = this->Makefile;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_280,"CMAKE_",lang);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_280,"_COMPILER_ID");
        psVar4 = cmMakefile::GetSafeDefinition(pcVar1,(string *)local_2b0);
        bVar2 = std::operator==(psVar4,"OpenWatcom");
        if (bVar2) {
LAB_001d487a:
          bVar3 = cmSystemTools::GetErrorOccurredFlag();
          bVar3 = !bVar3;
          if (!bVar2) goto LAB_001d4890;
        }
        else {
          pcVar1 = this->Makefile;
          std::operator+(&local_d0,"CMAKE_",lang);
          std::operator+(&local_b0,&local_d0,"_SIMULATE_ID");
          psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_b0);
          bVar3 = std::operator==(psVar4,"OpenWatcom");
          if (bVar3) goto LAB_001d487a;
          bVar3 = false;
LAB_001d4890:
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_d0);
        }
        std::__cxx11::string::~string((string *)local_2b0);
        std::__cxx11::string::~string((string *)&local_280);
        if (bVar3) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &msvcDebugInformationFormat,"WATCOM_RUNTIME_LIBRARY value \'",
                         &msvcRuntimeLibrary);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1a0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &msvcDebugInformationFormat,"\' not known for this ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_280,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1a0,lang);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_280," compiler.");
          IssueMessage(this,FATAL_ERROR,(string *)local_2b0);
          std::__cxx11::string::~string((string *)local_2b0);
          std::__cxx11::string::~string((string *)&local_280);
          std::__cxx11::string::~string((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&msvcDebugInformationFormat);
        }
      }
      else {
        AppendCompileOptions(this,flags,cVar5.Value,(char *)0x0);
      }
    }
    std::__cxx11::string::~string((string *)&msvcRuntimeLibrary);
  }
  GetMSVCDebugFormatName(&msvcDebugInformationFormat,this,config,target);
  if ((msvcDebugInformationFormat.
       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       ._M_payload.
       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
       .
       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ._M_engaged != true) ||
     (msvcDebugInformationFormat.
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_string_length == 0)) goto LAB_001d4baa;
  pcVar1 = this->Makefile;
  msvcRuntimeLibrary._M_dataplus._M_p = &DAT_00000006;
  msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
  local_2b0._8_8_ = (lang->_M_dataplus)._M_p;
  local_2b0._0_8_ = lang->_M_string_length;
  cmStrCat<char[48],std::__cxx11::string>
            ((string *)&local_280,(cmAlphaNum *)&msvcRuntimeLibrary,(cmAlphaNum *)local_2b0,
             (char (*) [48])"_COMPILE_OPTIONS_MSVC_DEBUG_INFORMATION_FORMAT_",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &msvcDebugInformationFormat);
  cVar5 = cmMakefile::GetDefinition(pcVar1,(string *)&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  if (cVar5.Value != (string *)0x0) {
    AppendCompileOptions(this,flags,cVar5.Value,(char *)0x0);
    goto LAB_001d4baa;
  }
  pcVar1 = this->Makefile;
  msvcRuntimeLibrary._M_dataplus._M_p = &DAT_00000006;
  msvcRuntimeLibrary._M_string_length = (long)"The CMAKE_" + 4;
  local_2b0._8_8_ = (lang->_M_dataplus)._M_p;
  local_2b0._0_8_ = lang->_M_string_length;
  cmStrCat<char[13]>(&local_f0,(cmAlphaNum *)&msvcRuntimeLibrary,(cmAlphaNum *)local_2b0,
                     (char (*) [13])0x5e1ada);
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_f0);
  __x._M_str = (psVar4->_M_dataplus)._M_p;
  __x._M_len = psVar4->_M_string_length;
  __y._M_str = "MSVC";
  __y._M_len = 4;
  bVar2 = std::operator==(__x,__y);
  if (bVar2) {
LAB_001d4b0a:
    bVar3 = cmSystemTools::GetErrorOccurredFlag();
    bVar3 = !bVar3;
    if (!bVar2) goto LAB_001d4b20;
  }
  else {
    pcVar1 = this->Makefile;
    local_280.View_._M_len = (size_t)&DAT_00000006;
    local_280.View_._M_str = "CMAKE_";
    local_1a0.View_._M_str = (lang->_M_dataplus)._M_p;
    local_1a0.View_._M_len = lang->_M_string_length;
    cmStrCat<char[13]>(&local_110,&local_280,&local_1a0,(char (*) [13])0x5b7197);
    psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_110);
    __x_00._M_str = (psVar4->_M_dataplus)._M_p;
    __x_00._M_len = psVar4->_M_string_length;
    __y_00._M_str = "MSVC";
    __y_00._M_len = 4;
    bVar3 = std::operator==(__x_00,__y_00);
    if (bVar3) goto LAB_001d4b0a;
    bVar3 = false;
LAB_001d4b20:
    std::__cxx11::string::~string((string *)&local_110);
  }
  std::__cxx11::string::~string((string *)&local_f0);
  if (bVar3) {
    msvcRuntimeLibrary._M_dataplus._M_p = (pointer)0x25;
    msvcRuntimeLibrary._M_string_length = (size_type)anon_var_dwarf_3e2394;
    local_2b0._0_8_ =
         msvcDebugInformationFormat.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_string_length;
    local_2b0._8_8_ =
         msvcDebugInformationFormat.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_dataplus._M_p;
    cmStrCat<char[22],std::__cxx11::string,char[11]>
              ((string *)&local_280,(cmAlphaNum *)&msvcRuntimeLibrary,(cmAlphaNum *)local_2b0,
               (char (*) [22])"\' not known for this ",lang,(char (*) [11])0x5bfefe);
    IssueMessage(this,FATAL_ERROR,(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
  }
LAB_001d4baa:
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&msvcDebugInformationFormat);
  std::__cxx11::string::~string((string *)&compilerSimulateId);
  std::__cxx11::string::~string((string *)&compiler);
  return;
}

Assistant:

void cmLocalGenerator::AddLanguageFlags(std::string& flags,
                                        cmGeneratorTarget const* target,
                                        cmBuildStep compileOrLink,
                                        const std::string& lang,
                                        const std::string& config)
{
  // Add language-specific flags.
  this->AddConfigVariableFlags(flags, cmStrCat("CMAKE_", lang, "_FLAGS"),
                               config);

  std::string compiler = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILER_ID"));

  std::string compilerSimulateId = this->Makefile->GetSafeDefinition(
    cmStrCat("CMAKE_", lang, "_SIMULATE_ID"));

  if (lang == "Swift") {
    if (cmValue v = target->GetProperty("Swift_LANGUAGE_VERSION")) {
      if (cmSystemTools::VersionCompare(
            cmSystemTools::OP_GREATER_EQUAL,
            this->Makefile->GetDefinition("CMAKE_Swift_COMPILER_VERSION"),
            "4.2")) {
        this->AppendFlags(flags, "-swift-version " + *v);
      }
    }
  } else if (lang == "CUDA") {
    target->AddCUDAArchitectureFlags(compileOrLink, config, flags);
    target->AddCUDAToolkitFlags(flags);
  } else if (lang == "ISPC") {
    target->AddISPCTargetFlags(flags);
  } else if (lang == "RC" &&
             this->Makefile->GetSafeDefinition("CMAKE_RC_COMPILER")
                 .find("llvm-rc") != std::string::npos) {
    compiler = this->Makefile->GetSafeDefinition("CMAKE_C_COMPILER_ID");
    if (!compiler.empty()) {
      compilerSimulateId =
        this->Makefile->GetSafeDefinition("CMAKE_C_SIMULATE_ID");
    } else {
      compiler = this->Makefile->GetSafeDefinition("CMAKE_CXX_COMPILER_ID");
      compilerSimulateId =
        this->Makefile->GetSafeDefinition("CMAKE_CXX_SIMULATE_ID");
    }
  } else if (lang == "HIP") {
    target->AddHIPArchitectureFlags(flags);
  }

  // Add VFS Overlay for Clang compilers
  if (compiler == "Clang") {
    if (cmValue vfsOverlay =
          this->Makefile->GetDefinition("CMAKE_CLANG_VFS_OVERLAY")) {
      if (compilerSimulateId == "MSVC") {
        this->AppendCompileOptions(
          flags,
          std::vector<std::string>{ "-Xclang", "-ivfsoverlay", "-Xclang",
                                    *vfsOverlay });
      } else {
        this->AppendCompileOptions(
          flags, std::vector<std::string>{ "-ivfsoverlay", *vfsOverlay });
      }
    }
  }
  // Add MSVC runtime library flags.  This is activated by the presence
  // of a default selection whether or not it is overridden by a property.
  cmValue msvcRuntimeLibraryDefault =
    this->Makefile->GetDefinition("CMAKE_MSVC_RUNTIME_LIBRARY_DEFAULT");
  if (cmNonempty(msvcRuntimeLibraryDefault)) {
    cmValue msvcRuntimeLibraryValue =
      target->GetProperty("MSVC_RUNTIME_LIBRARY");
    if (!msvcRuntimeLibraryValue) {
      msvcRuntimeLibraryValue = msvcRuntimeLibraryDefault;
    }
    std::string const msvcRuntimeLibrary = cmGeneratorExpression::Evaluate(
      *msvcRuntimeLibraryValue, this, config, target);
    if (!msvcRuntimeLibrary.empty()) {
      if (cmValue msvcRuntimeLibraryOptions = this->Makefile->GetDefinition(
            "CMAKE_" + lang + "_COMPILE_OPTIONS_MSVC_RUNTIME_LIBRARY_" +
            msvcRuntimeLibrary)) {
        this->AppendCompileOptions(flags, *msvcRuntimeLibraryOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_COMPILER_ID") == "MSVC" ||
                  this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_SIMULATE_ID") == "MSVC") &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the MSVC ABI so it needs a known runtime library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           "MSVC_RUNTIME_LIBRARY value '" +
                             msvcRuntimeLibrary + "' not known for this " +
                             lang + " compiler.");
      }
    }
  }

  // Add Watcom runtime library flags.  This is activated by the presence
  // of a default selection whether or not it is overridden by a property.
  cmValue watcomRuntimeLibraryDefault =
    this->Makefile->GetDefinition("CMAKE_WATCOM_RUNTIME_LIBRARY_DEFAULT");
  if (cmNonempty(watcomRuntimeLibraryDefault)) {
    cmValue watcomRuntimeLibraryValue =
      target->GetProperty("WATCOM_RUNTIME_LIBRARY");
    if (!watcomRuntimeLibraryValue) {
      watcomRuntimeLibraryValue = watcomRuntimeLibraryDefault;
    }
    std::string const watcomRuntimeLibrary = cmGeneratorExpression::Evaluate(
      *watcomRuntimeLibraryValue, this, config, target);
    if (!watcomRuntimeLibrary.empty()) {
      if (cmValue watcomRuntimeLibraryOptions = this->Makefile->GetDefinition(
            "CMAKE_" + lang + "_COMPILE_OPTIONS_WATCOM_RUNTIME_LIBRARY_" +
            watcomRuntimeLibrary)) {
        this->AppendCompileOptions(flags, *watcomRuntimeLibraryOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_COMPILER_ID") == "OpenWatcom" ||
                  this->Makefile->GetSafeDefinition(
                    "CMAKE_" + lang + "_SIMULATE_ID") == "OpenWatcom") &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the Watcom ABI so it needs a known runtime
        // library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           "WATCOM_RUNTIME_LIBRARY value '" +
                             watcomRuntimeLibrary + "' not known for this " +
                             lang + " compiler.");
      }
    }
  }

  // Add MSVC debug information format flags if CMP0141 is NEW.
  if (cm::optional<std::string> msvcDebugInformationFormat =
        this->GetMSVCDebugFormatName(config, target)) {
    if (!msvcDebugInformationFormat->empty()) {
      if (cmValue msvcDebugInformationFormatOptions =
            this->Makefile->GetDefinition(
              cmStrCat("CMAKE_", lang,
                       "_COMPILE_OPTIONS_MSVC_DEBUG_INFORMATION_FORMAT_",
                       *msvcDebugInformationFormat))) {
        this->AppendCompileOptions(flags, *msvcDebugInformationFormatOptions);
      } else if ((this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_COMPILER_ID")) == "MSVC"_s ||
                  this->Makefile->GetSafeDefinition(
                    cmStrCat("CMAKE_", lang, "_SIMULATE_ID")) == "MSVC"_s) &&
                 !cmSystemTools::GetErrorOccurredFlag()) {
        // The compiler uses the MSVC ABI so it needs a known runtime library.
        this->IssueMessage(MessageType::FATAL_ERROR,
                           cmStrCat("MSVC_DEBUG_INFORMATION_FORMAT value '",
                                    *msvcDebugInformationFormat,
                                    "' not known for this ", lang,
                                    " compiler."));
      }
    }
  }
}